

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_coroutine_create(lua_State *L)

{
  TValue *pTVar1;
  lua_State *plVar2;
  lua_State *in_RDI;
  lua_State *L1;
  undefined8 in_stack_ffffffffffffff88;
  lua_State *in_stack_ffffffffffffff98;
  
  if ((in_RDI->base < in_RDI->top) && ((in_RDI->base->field_2).it == 0xfffffff7)) {
    plVar2 = lua_newthread(in_stack_ffffffffffffff98);
    pTVar1 = plVar2->top;
    plVar2->top = pTVar1 + 1;
    (pTVar1->field_2).field_0 = (in_RDI->base->field_2).field_0;
    (pTVar1->field_2).it = 0xfffffff7;
    return 1;
  }
  lj_err_argt(in_RDI,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88)
  ;
}

Assistant:

LJLIB_CF(coroutine_create)
{
  lua_State *L1;
  if (!(L->base < L->top && tvisfunc(L->base)))
    lj_err_argt(L, 1, LUA_TFUNCTION);
  L1 = lua_newthread(L);
  setfuncV(L, L1->top++, funcV(L->base));
  return 1;
}